

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnElemSegmentElemType
          (BinaryReaderLogging *this,Index index,Type elem_type)

{
  Stream *this_00;
  uint uVar1;
  Enum EVar2;
  undefined8 uVar3;
  string local_48;
  uint local_24;
  BinaryReaderLogging *pBStack_20;
  Index index_local;
  BinaryReaderLogging *this_local;
  Type elem_type_local;
  
  local_24 = index;
  pBStack_20 = this;
  unique0x100000ce = elem_type;
  WriteIndent(this);
  uVar1 = local_24;
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_48,(Type *)((long)&this_local + 4));
  uVar3 = std::__cxx11::string::c_str();
  Stream::Writef(this_00,"OnElemSegmentElemType(index: %u, type: %s)\n",(ulong)uVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_48);
  EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x93])
                    (this->reader_,(ulong)local_24,stack0xffffffffffffffec);
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderLogging::OnElemSegmentElemType(Index index, Type elem_type) {
  LOGF("OnElemSegmentElemType(index: %" PRIindex ", type: %s)\n", index,
       elem_type.GetName().c_str());
  return reader_->OnElemSegmentElemType(index, elem_type);
}